

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ktrade.cpp
# Opt level: O3

void __thiscall Kraken::KTrade::KTrade(KTrade *this,JSONNode *node)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  internalJSONNode *piVar3;
  pointer pcVar4;
  JSONNode *pJVar5;
  double dVar6;
  undefined1 *local_220;
  long local_218;
  undefined1 local_210 [16];
  string *local_200;
  json_string local_1f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1d8;
  undefined1 *local_1d0;
  long local_1c8;
  undefined1 local_1c0 [16];
  json_string local_1b0 [3];
  ios_base local_138 [264];
  
  local_1d8 = &(this->misc).field_2;
  (this->misc)._M_dataplus._M_p = (pointer)local_1d8;
  (this->misc)._M_string_length = 0;
  (this->misc).field_2._M_local_buf[0] = '\0';
  pJVar5 = ::JSONNode::operator[](node,0);
  paVar2 = &local_1b0[0].field_2;
  local_1b0[0].field_2._M_allocated_capacity._0_7_ = 0x65746e69206f6e;
  local_1b0[0].field_2._7_4_ = 0x6c616e72;
  local_1b0[0]._M_string_length = 0xb;
  local_1b0[0].field_2._M_local_buf[0xb] = '\0';
  local_1b0[0]._M_dataplus._M_p = (pointer)paVar2;
  JSONDebug::_JSON_ASSERT(pJVar5->internal != (internalJSONNode *)0x0,local_1b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_1b0[0]._M_dataplus._M_p);
  }
  dVar6 = internalJSONNode::operator_cast_to_double(pJVar5->internal);
  this->price = dVar6;
  pJVar5 = ::JSONNode::operator[](node,1);
  local_1b0[0].field_2._M_allocated_capacity._0_7_ = 0x65746e69206f6e;
  local_1b0[0].field_2._7_4_ = 0x6c616e72;
  local_1b0[0]._M_string_length = 0xb;
  local_1b0[0].field_2._M_local_buf[0xb] = '\0';
  local_1b0[0]._M_dataplus._M_p = (pointer)paVar2;
  JSONDebug::_JSON_ASSERT(pJVar5->internal != (internalJSONNode *)0x0,local_1b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_1b0[0]._M_dataplus._M_p);
  }
  dVar6 = internalJSONNode::operator_cast_to_double(pJVar5->internal);
  this->volume = dVar6;
  pJVar5 = ::JSONNode::operator[](node,2);
  local_1f8.field_2._M_allocated_capacity._0_7_ = 0x65746e69206f6e;
  local_1f8.field_2._7_4_ = 0x6c616e72;
  local_1f8._M_string_length = 0xb;
  local_1f8.field_2._M_local_buf[0xb] = '\0';
  local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
  JSONDebug::_JSON_ASSERT(pJVar5->internal != (internalJSONNode *)0x0,&local_1f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
    operator_delete(local_1f8._M_dataplus._M_p);
  }
  piVar3 = pJVar5->internal;
  internalJSONNode::Fetch(piVar3);
  pcVar4 = (piVar3->_string)._M_dataplus._M_p;
  local_1d0 = local_1c0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1d0,pcVar4,pcVar4 + (piVar3->_string)._M_string_length);
  local_200 = (string *)&this->misc;
  local_220 = local_210;
  std::__cxx11::string::_M_construct<char*>((string *)&local_220,local_1d0,local_1d0 + local_1c8);
  std::__cxx11::istringstream::istringstream((istringstream *)local_1b0,(string *)&local_220,_S_in);
  std::istream::_M_extract<long>((long *)local_1b0);
  std::__cxx11::istringstream::~istringstream((istringstream *)local_1b0);
  std::ios_base::~ios_base(local_138);
  if (local_220 != local_210) {
    operator_delete(local_220);
  }
  if (local_1d0 != local_1c0) {
    operator_delete(local_1d0);
  }
  pJVar5 = ::JSONNode::operator[](node,3);
  local_1b0[0].field_2._M_allocated_capacity._0_7_ = 0x65746e69206f6e;
  local_1b0[0].field_2._7_4_ = 0x6c616e72;
  local_1b0[0]._M_string_length = 0xb;
  local_1b0[0].field_2._M_local_buf[0xb] = '\0';
  local_1b0[0]._M_dataplus._M_p = (pointer)paVar2;
  JSONDebug::_JSON_ASSERT(pJVar5->internal != (internalJSONNode *)0x0,local_1b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_1b0[0]._M_dataplus._M_p);
  }
  piVar3 = pJVar5->internal;
  internalJSONNode::Fetch(piVar3);
  pcVar4 = (piVar3->_string)._M_dataplus._M_p;
  local_220 = local_210;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_220,pcVar4,pcVar4 + (piVar3->_string)._M_string_length);
  local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_1f8,local_220,local_220 + local_218);
  this->order = (int)*local_1f8._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
    operator_delete(local_1f8._M_dataplus._M_p);
  }
  if (local_220 != local_210) {
    operator_delete(local_220);
  }
  pJVar5 = ::JSONNode::operator[](node,4);
  local_1b0[0].field_2._M_allocated_capacity._0_7_ = 0x65746e69206f6e;
  local_1b0[0].field_2._7_4_ = 0x6c616e72;
  local_1b0[0]._M_string_length = 0xb;
  local_1b0[0].field_2._M_local_buf[0xb] = '\0';
  local_1b0[0]._M_dataplus._M_p = (pointer)paVar2;
  JSONDebug::_JSON_ASSERT(pJVar5->internal != (internalJSONNode *)0x0,local_1b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_1b0[0]._M_dataplus._M_p);
  }
  piVar3 = pJVar5->internal;
  internalJSONNode::Fetch(piVar3);
  pcVar4 = (piVar3->_string)._M_dataplus._M_p;
  local_220 = local_210;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_220,pcVar4,pcVar4 + (piVar3->_string)._M_string_length);
  paVar1 = &local_1f8.field_2;
  local_1f8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>((string *)&local_1f8,local_220,local_220 + local_218);
  this->otype = (int)*local_1f8._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1f8._M_dataplus._M_p);
  }
  if (local_220 != local_210) {
    operator_delete(local_220);
  }
  pJVar5 = ::JSONNode::operator[](node,5);
  local_1b0[0].field_2._M_allocated_capacity._0_7_ = 0x65746e69206f6e;
  local_1b0[0].field_2._7_4_ = 0x6c616e72;
  local_1b0[0]._M_string_length = 0xb;
  local_1b0[0].field_2._M_local_buf[0xb] = '\0';
  local_1b0[0]._M_dataplus._M_p = (pointer)paVar2;
  JSONDebug::_JSON_ASSERT(pJVar5->internal != (internalJSONNode *)0x0,local_1b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_1b0[0]._M_dataplus._M_p);
  }
  piVar3 = pJVar5->internal;
  internalJSONNode::Fetch(piVar3);
  pcVar4 = (piVar3->_string)._M_dataplus._M_p;
  local_220 = local_210;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_220,pcVar4,pcVar4 + (piVar3->_string)._M_string_length);
  local_1f8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>((string *)&local_1f8,local_220,local_220 + local_218);
  std::__cxx11::string::operator=(local_200,(string *)&local_1f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1f8._M_dataplus._M_p);
  }
  if (local_220 != local_210) {
    operator_delete(local_220);
  }
  return;
}

Assistant:

KTrade::KTrade(JSONNode node) 
{
   price  = node[0].as_float();
   volume = node[1].as_float();
   std::istringstream( libjson::to_std_string(node[2].as_string()) ) >> time;
   
   order = static_cast<Order_t>
      ( libjson::to_std_string(node[3].as_string())[0] );
   otype = static_cast<Otype_t>
      ( libjson::to_std_string(node[4].as_string())[0] );
   
   misc = libjson::to_std_string(node[5].as_string()); 
}